

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  uint in_EAX;
  int iVar1;
  Fib *this;
  ostream *poVar2;
  uint uStack_18;
  int n;
  
  uStack_18 = in_EAX;
  this = (Fib *)operator_new(1);
  _uStack_18 = (ulong)uStack_18;
  std::istream::operator>>((istream *)&std::cin,&n);
  iVar1 = Fib::calculate(this,n);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  operator_delete(this);
  return 0;
}

Assistant:

int main()
{
  Fib * fib = new Fib();
  int n = 0;
  std::cin >> n;
  int result = fib->calculate(n);
  std::cout << result << std::endl;
  delete(fib);
}